

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O1

el_action_t ed_prev_word(EditLine *el,wint_t c)

{
  wchar_t *p;
  el_action_t eVar1;
  wchar_t *pwVar2;
  
  pwVar2 = (el->el_line).buffer;
  p = (el->el_line).cursor;
  if (p == pwVar2) {
    eVar1 = '\x06';
  }
  else {
    pwVar2 = c__prev_word(p,pwVar2,(el->el_state).argument,ce__isword);
    (el->el_line).cursor = pwVar2;
    eVar1 = '\x05';
    if (((el->el_map).type == L'\x01') && ((el->el_chared).c_vcmd.action != L'\0')) {
      cv_delfini(el);
      eVar1 = '\x04';
    }
  }
  return eVar1;
}

Assistant:

libedit_private el_action_t
/*ARGSUSED*/
ed_prev_word(EditLine *el, wint_t c __attribute__((__unused__)))
{

	if (el->el_line.cursor == el->el_line.buffer)
		return CC_ERROR;

	el->el_line.cursor = c__prev_word(el->el_line.cursor,
	    el->el_line.buffer,
	    el->el_state.argument,
	    ce__isword);

	if (el->el_map.type == MAP_VI)
		if (el->el_chared.c_vcmd.action != NOP) {
			cv_delfini(el);
			return CC_REFRESH;
		}
	return CC_CURSOR;
}